

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sat.cpp
# Opt level: O1

void __thiscall SAT::aEnqueue(SAT *this,Lit p,Reason r,int l)

{
  ostream *poVar1;
  uint uVar2;
  Lit local_6c;
  string local_68;
  string local_48;
  
  local_6c.x = p.x;
  if (so.debug) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"a-enqueue literal ",0x12);
    getLitString_abi_cxx11_(&local_48,local_6c.x);
    poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cerr,local_48._M_dataplus._M_p,local_48._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar1," because ",9);
    showReason_abi_cxx11_(&local_68,r);
    poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar1,local_68._M_dataplus._M_p,local_68._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar1," and l=",7);
    poVar1 = (ostream *)std::ostream::operator<<((ostream *)poVar1,l);
    std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\n",1);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_68._M_dataplus._M_p != &local_68.field_2) {
      operator_delete(local_68._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_48._M_dataplus._M_p != &local_48.field_2) {
      operator_delete(local_48._M_dataplus._M_p);
    }
  }
  uVar2 = local_6c.x >> 1;
  (this->assigns).data[uVar2] = -((byte)local_6c.x & 1) | 1;
  (this->trailpos).data[uVar2] = engine.trail_lim.data[(uint)l] + -1;
  (this->reason).data[uVar2].field_0 = r.field_0;
  vec<Lit>::push((this->trail).data + (uint)l,&local_6c);
  return;
}

Assistant:

void SAT::aEnqueue(Lit p, Reason r, int l) {
	if (so.debug) {
		std::cerr << "a-enqueue literal " << getLitString(toInt(p)) << " because " << showReason(r)
							<< " and l=" << l << "\n";
	}
	assert(value(p) == l_Undef);
	const int v = var(p);
	assigns[v] = toInt(lbool(!sign(p)));
	trailpos[v] = engine.trail_lim[l] - 1;
	reason[v] = r;
	trail[l].push(p);
}